

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::BuildImplicitArgIns(IRBuilder *this)

{
  ArgSlot AVar1;
  RegSlot RVar2;
  JITTimeFunctionBody *pJVar3;
  ArgSlot i;
  uint uVar4;
  
  pJVar3 = Func::GetJITFunctionBody(this->m_func);
  RVar2 = JITTimeFunctionBody::GetConstCount(pJVar3);
  uVar4 = 1;
  while( true ) {
    pJVar3 = Func::GetJITFunctionBody(this->m_func);
    AVar1 = JITTimeFunctionBody::GetInParamsCount(pJVar3);
    if (AVar1 <= uVar4) break;
    BuildArgIn(this,0xffffffff,(RVar2 + uVar4) - 1,(uint16)uVar4);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void
IRBuilder::BuildImplicitArgIns()
{
    Js::RegSlot startReg = m_func->GetJITFunctionBody()->GetConstCount() - 1;
    for (Js::ArgSlot i = 1; i < m_func->GetJITFunctionBody()->GetInParamsCount(); i++)
    {
        this->BuildArgIn((uint32)-1, startReg + i, i);
    }
}